

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-grammar-integration.cpp
# Opt level: O3

void test_grammar(string *test_desc,string *grammar_str,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *passing_strings,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *failing_strings)

{
  long *plVar1;
  string *psVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_68 [2];
  long local_58 [2];
  string *local_48;
  long local_40;
  _Alloc_hider local_38;
  size_type sStack_30;
  
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,test_desc,
             (long)&(grammar_str->_M_dataplus)._M_p + (long)&(test_desc->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)local_68);
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_68,
                              (ulong)(passing_strings->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start);
  psVar2 = (string *)(plVar1 + 2);
  if ((string *)*plVar1 == psVar2) {
    local_38._M_p = (psVar2->_M_dataplus)._M_p;
    sStack_30 = plVar1[3];
    local_48 = (string *)&local_38;
  }
  else {
    local_38._M_p = (psVar2->_M_dataplus)._M_p;
    local_48 = (string *)*plVar1;
  }
  local_40 = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  test(local_48,(string *)passing_strings,failing_strings,in_R8);
  if (local_48 != (string *)&local_38) {
    operator_delete(local_48,(ulong)(local_38._M_p + 1));
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  return;
}

Assistant:

static void test_grammar(const std::string & test_desc, const std::string & grammar_str, const std::vector<std::string> & passing_strings, const std::vector<std::string> & failing_strings) {
    test(test_desc + ". Grammar: " + grammar_str, grammar_str, passing_strings, failing_strings);
}